

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerSetPagesize(Pager *pPager,u32 *pPageSize,int nReserve)

{
  char *pcVar1;
  uint szPage;
  sqlite3_io_methods *psVar2;
  int iVar3;
  char *p;
  ulong uVar4;
  long in_FS_OFFSET;
  i64 nByte;
  sqlite3_int64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  szPage = *pPageSize;
  uVar4 = (ulong)szPage;
  if ((((pPager->memDb != '\0') && (pPager->dbSize != 0)) ||
      (szPage == 0 || pPager->pPCache->nRefSum != 0)) || (szPage == (uint)pPager->pageSize)) {
LAB_00135a5c:
    *pPageSize = (u32)pPager->pageSize;
    if (nReserve < 0) {
      nReserve = (int)(ushort)pPager->nReserve;
    }
    pPager->nReserve = (i16)nReserve;
    pagerFixMaplimit(pPager);
    iVar3 = 0;
    goto LAB_00135a82;
  }
  local_40 = 0;
  if (pPager->eState == '\0') {
LAB_00135ad4:
    p = (char *)pcache1Alloc(szPage + 8);
    if (p == (char *)0x0) {
      iVar3 = 7;
      goto LAB_00135b13;
    }
    pcVar1 = p + uVar4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pager_reset(pPager);
    iVar3 = sqlite3PcacheSetPageSize(pPager->pPCache,szPage);
    if (iVar3 == 0) {
      pcache1Free(pPager->pTmpSpace);
      pPager->pTmpSpace = p;
      pPager->dbSize = (Pgno)((long)(local_40 + uVar4 + -1) / (long)uVar4);
      pPager->pageSize = uVar4;
      pPager->lckPgno = (uint)sqlite3PendingByte / szPage + 1;
      goto LAB_00135a5c;
    }
  }
  else {
    psVar2 = pPager->fd->pMethods;
    if ((psVar2 == (sqlite3_io_methods *)0x0) ||
       (iVar3 = (*psVar2->xFileSize)(pPager->fd,&local_40), iVar3 == 0)) goto LAB_00135ad4;
LAB_00135b13:
    p = (char *)0x0;
  }
  pcache1Free(p);
  *pPageSize = (u32)pPager->pageSize;
LAB_00135a82:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSetPagesize(Pager *pPager, u32 *pPageSize, int nReserve){
  int rc = SQLITE_OK;

  /* It is not possible to do a full assert_pager_state() here, as this
  ** function may be called from within PagerOpen(), before the state
  ** of the Pager object is internally consistent.
  **
  ** At one point this function returned an error if the pager was in
  ** PAGER_ERROR state. But since PAGER_ERROR state guarantees that
  ** there is at least one outstanding page reference, this function
  ** is a no-op for that case anyhow.
  */

  u32 pageSize = *pPageSize;
  assert( pageSize==0 || (pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE) );
  if( (pPager->memDb==0 || pPager->dbSize==0)
   && sqlite3PcacheRefCount(pPager->pPCache)==0
   && pageSize && pageSize!=(u32)pPager->pageSize
  ){
    char *pNew = NULL;             /* New temp space */
    i64 nByte = 0;

    if( pPager->eState>PAGER_OPEN && isOpen(pPager->fd) ){
      rc = sqlite3OsFileSize(pPager->fd, &nByte);
    }
    if( rc==SQLITE_OK ){
      /* 8 bytes of zeroed overrun space is sufficient so that the b-tree
      * cell header parser will never run off the end of the allocation */
      pNew = (char *)sqlite3PageMalloc(pageSize+8);
      if( !pNew ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        memset(pNew+pageSize, 0, 8);
      }
    }

    if( rc==SQLITE_OK ){
      pager_reset(pPager);
      rc = sqlite3PcacheSetPageSize(pPager->pPCache, pageSize);
    }
    if( rc==SQLITE_OK ){
      sqlite3PageFree(pPager->pTmpSpace);
      pPager->pTmpSpace = pNew;
      pPager->dbSize = (Pgno)((nByte+pageSize-1)/pageSize);
      pPager->pageSize = pageSize;
      pPager->lckPgno = (Pgno)(PENDING_BYTE/pageSize) + 1;
    }else{
      sqlite3PageFree(pNew);
    }
  }

  *pPageSize = pPager->pageSize;
  if( rc==SQLITE_OK ){
    if( nReserve<0 ) nReserve = pPager->nReserve;
    assert( nReserve>=0 && nReserve<1000 );
    pPager->nReserve = (i16)nReserve;
    pagerFixMaplimit(pPager);
  }
  return rc;
}